

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.cpp
# Opt level: O0

void fe::operations::blitColored(ImageData *src,ImageData *dest,Color *c)

{
  op_blit_colored local_28;
  anon_union_4_3_3c41bd51_for_Pixel_0 local_24;
  op_blit_colored op;
  Pixel p;
  Color *c_local;
  ImageData *dest_local;
  ImageData *src_local;
  
  local_24.field_0.bytes[0] = (c->super_fe_color).field_0.rgba.r;
  local_24.field_0.bytes[1] = (c->super_fe_color).field_0.rgba.g;
  local_24.field_0.bytes[2] = (c->super_fe_color).field_0.rgba.b;
  local_24.field_0.bytes[3] = (c->super_fe_color).field_0.rgba.a;
  _op = c;
  op_blit_colored::op_blit_colored(&local_28,(Pixel *)&local_24.field_0);
  applyOperation<fe::operations::op_blit_colored>(&local_28,src,dest);
  return;
}

Assistant:

void blitColored(const ImageData& src, const ImageData& dest, const Color& c)
        {
            Pixel p;
            p.r = c.rgba.r;
            p.g = c.rgba.g;
            p.b = c.rgba.b;
            p.a = c.rgba.a;

            op_blit_colored op(p);
            applyOperation(op, src, dest);
        }